

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *begin;
  uint *out;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *data;
  size_t size;
  size_t in_stack_ffffffffffffffc8;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffd0;
  uint *end;
  
  sVar1 = buffer<unsigned_int>::size(in_RSI);
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  begin = buffer<unsigned_int>::data(in_RSI);
  end = begin + sVar1;
  out = buffer<unsigned_int>::data(in_RDI);
  copy<unsigned_int,_const_unsigned_int_*,_unsigned_int_*,_0>(begin,end,out);
  *(undefined4 *)&in_RDI[5].ptr_ = *(undefined4 *)&in_RSI[5].ptr_;
  return;
}

Assistant:

FMT_CONSTEXPR void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    copy<bigit>(data, data + size, bigits_.data());
    exp_ = other.exp_;
  }